

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O3

bool duckdb::TemplatedDecimalScaleUp<duckdb::hugeint_t,short,duckdb::Hugeint,duckdb::NumericHelper>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  DecimalScaleInput<duckdb::hugeint_t,_short> input;
  Vector *local_68;
  Vector *local_60;
  CastParameters *local_58;
  undefined1 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined2 local_38;
  byte local_36;
  byte local_35;
  
  bVar1 = DecimalType::GetScale(&source->type);
  bVar2 = DecimalType::GetWidth(&source->type);
  bVar3 = DecimalType::GetScale(&result->type);
  bVar4 = DecimalType::GetWidth(&result->type);
  local_38 = *(undefined2 *)(NumericHelper::POWERS_OF_TEN + ((ulong)bVar3 - (ulong)bVar1) * 8);
  uVar5 = (ulong)bVar4 - ((ulong)bVar3 - (ulong)bVar1);
  local_68 = result;
  local_60 = result;
  local_58 = parameters;
  if (bVar2 < uVar5) {
    local_50 = 1;
    UnaryExecutor::
    ExecuteStandard<duckdb::hugeint_t,short,duckdb::GenericUnaryWrapper,duckdb::DecimalScaleUpOperator>
              (source,result,count,&local_68,false,CAN_THROW_RUNTIME_ERROR);
    local_50 = 1;
  }
  else {
    lVar6 = uVar5 * 0x10;
    local_50 = 1;
    local_48 = *(undefined8 *)(Hugeint::POWERS_OF_TEN + lVar6);
    uStack_40 = *(undefined8 *)(Hugeint::POWERS_OF_TEN + lVar6 + 8);
    local_36 = bVar2;
    local_35 = bVar1;
    UnaryExecutor::
    ExecuteStandard<duckdb::hugeint_t,short,duckdb::GenericUnaryWrapper,duckdb::DecimalScaleUpCheckOperator>
              (source,result,count,&local_68,parameters->error_message != (string *)0x0,
               CAN_THROW_RUNTIME_ERROR);
  }
  return (bool)local_50;
}

Assistant:

bool TemplatedDecimalScaleUp(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto source_scale = DecimalType::GetScale(source.GetType());
	auto source_width = DecimalType::GetWidth(source.GetType());
	auto result_scale = DecimalType::GetScale(result.GetType());
	auto result_width = DecimalType::GetWidth(result.GetType());
	D_ASSERT(result_scale >= source_scale);
	idx_t scale_difference = result_scale - source_scale;
	DEST multiply_factor = UnsafeNumericCast<DEST>(POWERS_DEST::POWERS_OF_TEN[scale_difference]);
	idx_t target_width = result_width - scale_difference;
	if (source_width < target_width) {
		DecimalScaleInput<SOURCE, DEST> input(result, multiply_factor, parameters);
		// type will always fit: no need to check limit
		UnaryExecutor::GenericExecute<SOURCE, DEST, DecimalScaleUpOperator>(source, result, count, &input);
		return true;
	} else {
		// type might not fit: check limit
		auto limit = UnsafeNumericCast<SOURCE>(POWERS_SOURCE::POWERS_OF_TEN[target_width]);
		DecimalScaleInput<SOURCE, DEST> input(result, limit, multiply_factor, parameters, source_width, source_scale);
		UnaryExecutor::GenericExecute<SOURCE, DEST, DecimalScaleUpCheckOperator>(source, result, count, &input,
		                                                                         parameters.error_message);
		return input.vector_cast_data.all_converted;
	}
}